

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_parse_der_internal
              (mbedtls_x509_crt *chain,uchar *buf,size_t buflen,int make_copy,
              mbedtls_x509_crt_ext_cb_t cb,void *p_ctx)

{
  uint *val;
  size_t sVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  mbedtls_x509_crt *pmVar5;
  mbedtls_x509_crt *crt;
  mbedtls_x509_crt *pmVar6;
  size_t __size;
  uchar *end;
  mbedtls_x509_buf *alg;
  uchar *end_00;
  mbedtls_x509_crt *pmVar7;
  mbedtls_x509_buf local_c8;
  size_t local_b0;
  undefined1 auStack_a8 [8];
  mbedtls_x509_buf sig_params2;
  undefined1 auStack_88 [8];
  mbedtls_x509_buf sig_params1;
  size_t local_50;
  size_t len;
  uchar *local_40;
  uchar *p;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar5 = chain;
  pmVar6 = (mbedtls_x509_crt *)0x0;
  do {
    pmVar7 = pmVar6;
    pmVar6 = pmVar5;
    crt = pmVar6;
    if (pmVar6->version == 0) goto LAB_00213fe0;
    pmVar5 = pmVar6->next;
  } while (pmVar6->next != (mbedtls_x509_crt *)0x0);
  if ((pmVar6->version != 0) && (pmVar6->next == (mbedtls_x509_crt *)0x0)) {
    sig_params1.p = (uchar *)p_ctx;
    pmVar5 = (mbedtls_x509_crt *)calloc(1,0x2f0);
    pmVar6->next = pmVar5;
    if (pmVar5 == (mbedtls_x509_crt *)0x0) {
      return -0x2880;
    }
    memset(pmVar5,0,0x2f0);
    crt = pmVar6->next;
    p_ctx = sig_params1.p;
    pmVar7 = pmVar6;
  }
LAB_00213fe0:
  auStack_88 = (undefined1  [8])0x0;
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  auStack_a8 = (undefined1  [8])0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  local_c8.tag = 0;
  local_c8._4_4_ = 0;
  local_c8.len = 0;
  local_c8.p = (uchar *)0x0;
  iVar2 = -0x2800;
  if ((buf == (uchar *)0x0) || (crt == (mbedtls_x509_crt *)0x0)) goto LAB_00214066;
  sig_params1.p = (uchar *)p_ctx;
  local_50 = buflen;
  len = (size_t)chain;
  local_40 = buf;
  p = (uchar *)crt;
  iVar2 = mbedtls_asn1_get_tag(&local_40,buf + buflen,&local_50,0x30);
  crt = (mbedtls_x509_crt *)p;
  sVar1 = local_50;
  if (iVar2 != 0) {
    mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
    iVar2 = -0x2180;
    chain = (mbedtls_x509_crt *)len;
    goto LAB_00214066;
  }
  puVar4 = local_40 + local_50;
  __size = (long)puVar4 - (long)buf;
  *(size_t *)(p + 0x10) = __size;
  if (make_copy == 0) {
    *(uchar **)(p + 0x18) = buf;
    p[0] = '\0';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
  }
  else {
    puVar4 = (uchar *)calloc(1,__size);
    *(uchar **)(p + 0x18) = puVar4;
    if (puVar4 == (uchar *)0x0) {
      iVar2 = -0x2880;
      local_40 = (uchar *)0x0;
      crt = (mbedtls_x509_crt *)p;
      chain = (mbedtls_x509_crt *)len;
      goto LAB_00214066;
    }
    local_40 = puVar4;
    memcpy(puVar4,buf,__size);
    p[0] = '\x01';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
    local_40 = puVar4 + (__size - sVar1);
    puVar4 = puVar4 + __size;
  }
  crt = (mbedtls_x509_crt *)p;
  *(uchar **)(p + 0x30) = local_40;
  iVar2 = mbedtls_asn1_get_tag(&local_40,puVar4,&local_50,0x30);
  if (iVar2 != 0) {
    mbedtls_x509_crt_free(crt);
    iVar2 = iVar2 + -0x2180;
    chain = (mbedtls_x509_crt *)len;
    goto LAB_00214066;
  }
  end_00 = local_40 + local_50;
  *(long *)((long)crt + 0x28) = (long)end_00 - *(long *)((long)crt + 0x30);
  val = (uint *)((long)crt + 0x38);
  iVar2 = mbedtls_asn1_get_tag(&local_40,end_00,&local_b0,0xa0);
  if (iVar2 == 0) {
    end = local_40 + local_b0;
    iVar2 = mbedtls_asn1_get_int(&local_40,end,(int *)val);
    if (iVar2 == 0) {
      iVar2 = -0x2266;
      if (local_40 == end) {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = iVar2 + -0x2200;
    }
  }
  else if (iVar2 == -0x62) {
    *val = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = iVar2 + -0x2180;
  }
  pmVar5 = (mbedtls_x509_crt *)p;
  if ((iVar2 == 0) &&
     (iVar2 = mbedtls_x509_get_serial(&local_40,end_00,(mbedtls_x509_buf *)(p + 0x40)), iVar2 == 0))
  {
    alg = (mbedtls_x509_buf *)((long)pmVar5 + 0x58);
    iVar2 = mbedtls_x509_get_alg(&local_40,end_00,alg,(mbedtls_x509_buf *)auStack_88);
    crt = (mbedtls_x509_crt *)p;
    pmVar5 = (mbedtls_x509_crt *)p;
    if (iVar2 == 0) {
      if (2 < *val) {
        mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
        iVar2 = -0x2580;
        chain = (mbedtls_x509_crt *)len;
        goto LAB_00214066;
      }
      *(uint *)(p + 0x38) = *val + 1;
      iVar2 = mbedtls_x509_get_sig_alg
                        (alg,(mbedtls_x509_buf *)auStack_88,(mbedtls_md_type_t *)(p + 0x2d8),
                         (mbedtls_pk_type_t *)(p + 0x2dc),(void **)(p + 0x2e0));
      if (iVar2 == 0) {
        *(uchar **)((long)crt + 0x80) = local_40;
        iVar2 = mbedtls_asn1_get_tag(&local_40,end_00,&local_50,0x30);
        if (iVar2 != 0) {
          mbedtls_x509_crt_free(crt);
          iVar2 = iVar2 + -0x2180;
          chain = (mbedtls_x509_crt *)len;
          goto LAB_00214066;
        }
        iVar2 = mbedtls_x509_get_name
                          (&local_40,local_40 + local_50,(mbedtls_x509_name *)((long)crt + 0xa0));
        if (iVar2 == 0) {
          *(long *)((long)crt + 0x78) = (long)local_40 - *(long *)((long)crt + 0x80);
          iVar2 = x509_get_dates(&local_40,end_00,(mbedtls_x509_time *)((long)crt + 0x120),
                                 (mbedtls_x509_time *)((long)crt + 0x138));
          if (iVar2 == 0) {
            *(uchar **)(p + 0x98) = local_40;
            iVar2 = mbedtls_asn1_get_tag(&local_40,end_00,&local_50,0x30);
            crt = (mbedtls_x509_crt *)p;
            if (iVar2 != 0) {
              mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
              iVar2 = iVar2 + -0x2180;
              chain = (mbedtls_x509_crt *)len;
              goto LAB_00214066;
            }
            if ((local_50 == 0) ||
               (iVar2 = mbedtls_x509_get_name
                                  (&local_40,local_40 + local_50,(mbedtls_x509_name *)(p + 0xe0)),
               iVar2 == 0)) {
              *(long *)(p + 0x90) = (long)local_40 - *(long *)(p + 0x98);
              *(uchar **)(p + 0x160) = local_40;
              iVar2 = mbedtls_pk_parse_subpubkey(&local_40,end_00,(mbedtls_pk_context *)(p + 0x168))
              ;
              if ((((iVar2 == 0) &&
                   ((*(long *)(p + 0x158) = (long)local_40 - *(long *)(p + 0x160),
                    (*(uint *)(p + 0x38) & 0xfffffffe) != 2 ||
                    (iVar2 = x509_get_uid(&local_40,end_00,(mbedtls_x509_buf *)(p + 0x180),1),
                    iVar2 == 0)))) &&
                  (((*val & 0xfffffffe) != 2 ||
                   (iVar2 = x509_get_uid(&local_40,end_00,(mbedtls_x509_buf *)(p + 0x198),2),
                   iVar2 == 0)))) &&
                 ((*val != 3 ||
                  (iVar2 = x509_get_crt_ext(&local_40,end_00,(mbedtls_x509_crt *)p,cb,sig_params1.p)
                  , iVar2 == 0)))) {
                if (local_40 != end_00) {
LAB_002144f9:
                  crt = (mbedtls_x509_crt *)p;
                  mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
                  iVar2 = -0x21e6;
                  chain = (mbedtls_x509_crt *)len;
                  goto LAB_00214066;
                }
                iVar2 = mbedtls_x509_get_alg
                                  (&local_40,puVar4,&local_c8,(mbedtls_x509_buf *)auStack_a8);
                if (iVar2 == 0) {
                  if ((*(size_t *)(p + 0x60) == local_c8.len) &&
                     (iVar2 = bcmp(*(void **)(p + 0x68),local_c8.p,*(size_t *)(p + 0x60)),
                     iVar2 == 0)) {
                    if (((auStack_88._0_4_ == auStack_a8._0_4_) &&
                        (sig_params1._0_8_ == sig_params2._0_8_)) &&
                       ((sig_params1._0_8_ == 0 ||
                        (iVar2 = bcmp((void *)sig_params1.len,(void *)sig_params2.len,
                                      sig_params1._0_8_), iVar2 == 0)))) {
                      iVar2 = mbedtls_x509_get_sig(&local_40,puVar4,(mbedtls_x509_buf *)(p + 0x2c0))
                      ;
                      if (iVar2 == 0) {
                        if (local_40 == puVar4) {
                          iVar2 = 0;
                          crt = (mbedtls_x509_crt *)p;
                          chain = (mbedtls_x509_crt *)len;
                          goto LAB_00214066;
                        }
                        goto LAB_002144f9;
                      }
                      goto LAB_00214399;
                    }
                  }
                  crt = (mbedtls_x509_crt *)p;
                  mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
                  iVar2 = -0x2680;
                  chain = (mbedtls_x509_crt *)len;
                  goto LAB_00214066;
                }
              }
            }
          }
LAB_00214399:
          crt = (mbedtls_x509_crt *)p;
          mbedtls_x509_crt_free((mbedtls_x509_crt *)p);
          chain = (mbedtls_x509_crt *)len;
          goto LAB_00214066;
        }
      }
      mbedtls_x509_crt_free(crt);
      chain = (mbedtls_x509_crt *)len;
      goto LAB_00214066;
    }
  }
  mbedtls_x509_crt_free(pmVar5);
  crt = (mbedtls_x509_crt *)p;
  chain = (mbedtls_x509_crt *)len;
LAB_00214066:
  iVar3 = 0;
  if (iVar2 != 0) {
    if (pmVar7 != (mbedtls_x509_crt *)0x0) {
      pmVar7->next = (mbedtls_x509_crt *)0x0;
    }
    iVar3 = iVar2;
    if (crt != chain) {
      free(crt);
    }
  }
  return iVar3;
}

Assistant:

static int mbedtls_x509_crt_parse_der_internal(mbedtls_x509_crt *chain,
                                               const unsigned char *buf,
                                               size_t buflen,
                                               int make_copy,
                                               mbedtls_x509_crt_ext_cb_t cb,
                                               void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if (crt == NULL || buf == NULL) {
        return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
    }

    while (crt->version != 0 && crt->next != NULL) {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if (crt->version != 0 && crt->next == NULL) {
        crt->next = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));

        if (crt->next == NULL) {
            return MBEDTLS_ERR_X509_ALLOC_FAILED;
        }

        prev = crt;
        mbedtls_x509_crt_init(crt->next);
        crt = crt->next;
    }

    ret = x509_crt_parse_der_core(crt, buf, buflen, make_copy, cb, p_ctx);
    if (ret != 0) {
        if (prev) {
            prev->next = NULL;
        }

        if (crt != chain) {
            mbedtls_free(crt);
        }

        return ret;
    }

    return 0;
}